

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void ParseStructLabel(CStructure *st)

{
  bool bVar1;
  int iVar2;
  undefined1 local_818 [8];
  char temp [2048];
  char *tp;
  CStructure *st_local;
  
  if (PreviousIsLabel != (char *)0x0) {
    free(PreviousIsLabel);
    PreviousIsLabel = (char *)0x0;
  }
  bVar1 = White();
  if (!bVar1) {
    temp._2040_8_ = local_818;
    if (*lp == '.') {
      lp = lp + 1;
    }
    while( true ) {
      bVar1 = false;
      if (*lp != '\0') {
        iVar2 = islabchar(*lp);
        bVar1 = iVar2 != 0;
      }
      if (!bVar1) break;
      *(char *)temp._2040_8_ = *lp;
      temp._2040_8_ = temp._2040_8_ + 1;
      lp = lp + 1;
    }
    *(undefined1 *)temp._2040_8_ = 0;
    if (*lp == ':') {
      lp = lp + 1;
    }
    temp._2040_8_ = local_818;
    SkipBlanks();
    iVar2 = isdigit((uint)*(byte *)temp._2040_8_);
    if (iVar2 == 0) {
      PreviousIsLabel = strdup((char *)temp._2040_8_);
      if (PreviousIsLabel == (char *)0x0) {
        ErrorOOM();
      }
      CStructure::AddLabel(st,(char *)temp._2040_8_);
    }
    else {
      Error("[STRUCT] Number labels not allowed within structs",(char *)0x0,PASS3);
    }
  }
  return;
}

Assistant:

void ParseStructLabel(CStructure* st) {
	char* tp, temp[LINEMAX];
	if (PreviousIsLabel) {
		free(PreviousIsLabel);
		PreviousIsLabel = nullptr;
	}
	if (White()) {
		return;
	}
	tp = temp;
	if (*lp == '.') {
		++lp;
	}
	while (*lp && islabchar(*lp)) {
		*tp = *lp; ++tp; ++lp;
	}
	*tp = 0;
	if (*lp == ':') {
		++lp;
	}
	tp = temp; SkipBlanks();
	if (isdigit((byte)*tp)) {
		Error("[STRUCT] Number labels not allowed within structs"); return;
	}
	PreviousIsLabel = STRDUP(tp);
	if (PreviousIsLabel == NULL) ErrorOOM();
	st->AddLabel(tp);
}